

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.h
# Opt level: O2

void __thiscall CCoinsCacheEntry::CCoinsCacheEntry(CCoinsCacheEntry *this,Coin *coin_)

{
  long lVar1;
  undefined4 uVar2;
  size_type sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_prev = (CoinsCachePair *)0x0;
  this->m_next = (CoinsCachePair *)0x0;
  this->m_flags = '\0';
  (this->coin).out.nValue = (coin_->out).nValue;
  uVar2 = *(undefined4 *)((long)&(coin_->out).scriptPubKey.super_CScriptBase._union + 4);
  sVar3 = (coin_->out).scriptPubKey.super_CScriptBase._union.indirect_contents.capacity;
  uVar4 = *(undefined4 *)((long)&(coin_->out).scriptPubKey.super_CScriptBase._union + 0xc);
  uVar5 = *(undefined4 *)((long)&(coin_->out).scriptPubKey.super_CScriptBase._union + 0xc);
  uVar6 = *(undefined4 *)((long)&(coin_->out).scriptPubKey.super_CScriptBase._union + 0x10);
  uVar7 = *(undefined4 *)((long)&(coin_->out).scriptPubKey.super_CScriptBase._union + 0x14);
  uVar8 = *(undefined4 *)((long)&(coin_->out).scriptPubKey.super_CScriptBase._union + 0x18);
  *(undefined4 *)&(this->coin).out.scriptPubKey.super_CScriptBase._union =
       *(undefined4 *)&(coin_->out).scriptPubKey.super_CScriptBase._union;
  *(undefined4 *)((long)&(this->coin).out.scriptPubKey.super_CScriptBase._union + 4) = uVar2;
  (this->coin).out.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity = sVar3;
  *(undefined4 *)((long)&(this->coin).out.scriptPubKey.super_CScriptBase._union + 0xc) = uVar4;
  *(undefined4 *)((long)&(this->coin).out.scriptPubKey.super_CScriptBase._union + 0xc) = uVar5;
  *(undefined4 *)((long)&(this->coin).out.scriptPubKey.super_CScriptBase._union + 0x10) = uVar6;
  *(undefined4 *)((long)&(this->coin).out.scriptPubKey.super_CScriptBase._union + 0x14) = uVar7;
  *(undefined4 *)((long)&(this->coin).out.scriptPubKey.super_CScriptBase._union + 0x18) = uVar8;
  (this->coin).out.scriptPubKey.super_CScriptBase._size =
       (coin_->out).scriptPubKey.super_CScriptBase._size;
  (coin_->out).scriptPubKey.super_CScriptBase._size = 0;
  *(undefined4 *)&(this->coin).field_0x28 = *(undefined4 *)&coin_->field_0x28;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit CCoinsCacheEntry(Coin&& coin_) noexcept : coin(std::move(coin_)) {}